

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure744.c
# Opt level: O2

void test_write_disk_secure744(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ushort uVar9;
  int iVar10;
  wchar_t wVar11;
  uint *__s;
  archive *_a;
  archive_entry *paVar12;
  size_t sVar13;
  uint uVar14;
  size_t __maxlen;
  ulong uVar15;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  __s = (uint *)malloc(0x2000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                   ,L'/',(uint)(__s != (uint *)0x0),"buff != NULL",(void *)0x0);
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                  ,L'2',L'\x12');
  _a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                   ,L'5',(uint)(_a != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(_a,L'Ā');
  __maxlen = 0x1f9b;
  uVar14 = 0;
  uVar15 = 0;
  do {
    if (0x1e0b < uVar15) break;
    builtin_strncpy((char *)((long)__s + uVar15 + 0x50),"xxxxxxxxxxxxxxxx",0x10);
    builtin_strncpy((char *)((long)__s + uVar15 + 0x40),"xxxxxxxxxxxxxxxx",0x10);
    builtin_strncpy((char *)((long)__s + uVar15 + 0x30),"xxxxxxxxxxxxxxxx",0x10);
    builtin_strncpy((char *)((long)__s + uVar15 + 0x20),"xxxxxxxxxxxxxxxx",0x10);
    builtin_strncpy((char *)((long)__s + uVar15 + 0x10),"xxxxxxxxxxxxxxxx",0x10);
    builtin_strncpy((char *)((long)__s + uVar15),"xxxxxxxxxxxxxxxx",0x10);
    *(undefined4 *)((long)__s + uVar15 + 0x60) = 0x78787878;
    *(undefined1 *)((long)__s + uVar15 + 100) = 0;
    uVar1 = (ulong)uVar14 % 10;
    uVar2 = ((ulong)uVar14 / 10) % 10;
    uVar3 = ((ulong)uVar14 / 100) % 10;
    uVar4 = ((ulong)uVar14 / 1000) % 10;
    uVar9 = (ushort)uVar4;
    bVar5 = (uVar9 != 0) * (uVar9 < 0x100) * (char)uVar4 - (0xff < uVar9);
    uVar9 = (ushort)uVar3;
    bVar6 = (uVar9 != 0) * (uVar9 < 0x100) * (char)uVar3 - (0xff < uVar9);
    uVar9 = (ushort)uVar2;
    bVar7 = (uVar9 != 0) * (uVar9 < 0x100) * (char)uVar2 - (0xff < uVar9);
    uVar9 = (ushort)uVar1;
    bVar8 = (uVar9 != 0) * (uVar9 < 0x100) * (char)uVar1 - (0xff < uVar9);
    *__s = CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                    CONCAT12((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                             CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                      (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)))) |
           s_xxxxxxxxxxxxxxxx0000_002acf50._16_4_;
    *(undefined1 *)(__s + 1) = 0x5f;
    uVar14 = uVar14 + 1;
    paVar12 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                     ,L'E',(uint)(paVar12 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar12,(char *)__s);
    archive_entry_set_mode(paVar12,0x81ff);
    archive_entry_copy_symlink(paVar12,testworkdir);
    iVar10 = archive_write_header(_a,paVar12);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar10,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar12);
    *(undefined1 *)((long)__s + uVar15 + 100) = 0x2f;
    snprintf((char *)((long)__s + uVar15 + 0x65),__maxlen,"target%d",(ulong)uVar14);
    paVar12 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                     ,L'P',(uint)(paVar12 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar12,(char *)__s);
    archive_entry_set_mode(paVar12,0x41ff);
    iVar10 = archive_write_header(_a,paVar12);
    archive_entry_free(paVar12);
    sVar13 = strlen((char *)__s);
    failure("Attempt to create target%d via %d-character symlink should have failed",(ulong)uVar14,
            sVar13 & 0xffffffff);
    wVar11 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                                 ,L'W',-0x19,"ARCHIVE_FAILED",(long)iVar10,"t",(void *)0x0);
    __maxlen = __maxlen - 0x65;
    uVar15 = uVar15 + 0x65;
  } while (wVar11 != L'\0');
  archive_free(_a);
  free(__s);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure744)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk security checks not supported on Windows");
#else
	struct archive *a;
	struct archive_entry *ae;
	size_t buff_size = 8192;
	char *buff = malloc(buff_size);
	char *p = buff;
	int n = 0;
	int t;

	assert(buff != NULL);

	/* Start with a known umask. */
	assertUmask(UMASK);

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);

	while (p + 500 < buff + buff_size) {
		memset(p, 'x', 100);
		p += 100;
		p[0] = '\0';

		buff[0] = ((n / 1000) % 10) + '0';
		buff[1] = ((n / 100) % 10)+ '0';
		buff[2] = ((n / 10) % 10)+ '0';
		buff[3] = ((n / 1) % 10)+ '0';
		buff[4] = '_';
		++n;

		/* Create a symlink pointing to the testworkdir */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, buff);
		archive_entry_set_mode(ae, S_IFREG | 0777);
		archive_entry_copy_symlink(ae, testworkdir);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);

		*p++ = '/';
		snprintf(p, buff_size - (p - buff), "target%d", n);

		/* Try to create a file through the symlink, should fail. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, buff);
		archive_entry_set_mode(ae, S_IFDIR | 0777);

		t = archive_write_header(a, ae);
		archive_entry_free(ae);
		failure("Attempt to create target%d via %d-character symlink should have failed", n, (int)strlen(buff));
		if(!assertEqualInt(ARCHIVE_FAILED, t)) {
			break;
		}
	}
	archive_free(a);
	free(buff);
#endif
}